

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_stop_map(Parser *this)

{
  pfn_error p_Var1;
  Location LVar2;
  bool bVar3;
  error_flags eVar4;
  NodeData *str;
  Parser *in_RDI;
  Parser *unaff_retaddr;
  char msg [49];
  size_t in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  Location *in_stack_ffffffffffffff60;
  undefined8 local_80;
  size_t in_stack_ffffffffffffff88;
  Tree *in_stack_ffffffffffffff90;
  undefined8 uStack_68;
  size_t local_60;
  char local_58 [64];
  size_t local_18;
  Tree *local_10;
  
  local_10 = in_RDI->m_tree;
  local_18 = in_RDI->m_state->node_id;
  str = Tree::_p(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (((str->m_type).type & MAP) == NOTYPE) {
    memcpy(local_58,"check failed: (m_tree->is_map(m_state->node_id))",0x31);
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      trap_instruction();
    }
    p_Var1 = (in_RDI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50
                       ,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    LVar2.super_LineCol.line = in_stack_ffffffffffffff88;
    LVar2.super_LineCol.offset = local_80;
    LVar2.super_LineCol.col = (size_t)in_stack_ffffffffffffff90;
    LVar2.name.str = (char *)uStack_68;
    LVar2.name.len = local_60;
    (*p_Var1)(local_58,0x31,LVar2,(in_RDI->m_stack).m_callbacks.m_user_data);
  }
  bVar3 = has_all(in_RDI,0x60);
  if ((bVar3) && (bVar3 = has_all(in_RDI,0x200), !bVar3)) {
    _store_scalar_null(unaff_retaddr,(char *)str);
    _append_key_val_null(unaff_retaddr,(char *)str);
  }
  return;
}

Assistant:

void Parser::_stop_map()
{
    _c4dbgpf("stop_map[{}]", m_state->node_id);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(m_state->node_id));
    if(has_all(QMRK|RKEY) && !has_all(SSCL))
    {
        _c4dbgpf("stop_map[{}]: RKEY", m_state->node_id);
        _store_scalar_null(m_state->line_contents.rem.str);
        _append_key_val_null(m_state->line_contents.rem.str);
    }
}